

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# round_trip_wl.cpp
# Opt level: O3

int main(void)

{
  uint blocks;
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  uint bin;
  uint uVar4;
  int iVar5;
  Histogram<unsigned_int> histogram;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  result;
  WangLandauSampler sampler;
  FixedDegreeNetwork network;
  Random rng;
  string local_2918;
  string local_28f8;
  Histogram<unsigned_int> local_28d8;
  string local_28a8;
  string local_2888;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2868;
  WangLandauSampler local_2848;
  Network local_2800;
  Random local_2778;
  
  pcVar2 = getenv("BLOCKS");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "BLOCKS not defined";
  }
  else {
    blocks = atoi(pcVar2);
    pcVar2 = getenv("ROUND_TRIPS");
    if (pcVar2 != (char *)0x0) {
      uVar1 = atoi(pcVar2);
      FixedDegreeNetwork::FixedDegreeNetwork((FixedDegreeNetwork *)&local_2800,3,blocks);
      Histogram<unsigned_int>::Histogram
                (&local_28d8,0,local_2800.total_triangles / 3,local_2800.total_triangles / 3);
      Random::Random(&local_2778,2);
      local_2848.super_UniformSampler._vptr_UniformSampler = (_func_int **)&PTR_markov_step_0010bd08
      ;
      local_2848.super_UniformSampler.super_Sampler.rng = &local_2778;
      local_2848.super_UniformSampler.super_Sampler.histogram = &local_28d8;
      local_2848.super_UniformSampler.proposer.rng = &local_2778;
      local_2848.super_UniformSampler.network = &local_2800;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_2848.entropy,(ulong)(local_28d8._bins + 1),(allocator_type *)&local_2868);
      local_2848.f = 1.0;
      while (2 < local_2800.total_triangles) {
        WangLandauSampler::markov_step(&local_2848);
      }
      local_2868.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2868.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2868.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar5 = 0;
      do {
        uVar4 = 0;
        do {
          local_28d8._histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4] = 0;
          uVar4 = uVar4 + 1;
        } while (uVar4 <= local_28d8._bins);
        local_28d8._count = 0;
        for (uVar4 = uVar1; uVar4 != 0; uVar4 = uVar4 - 1) {
          WangLandauSampler::perform_round_trip(&local_2848);
        }
        local_2848.f = local_2848.f * 0.5;
        local_2918._M_dataplus._M_p = (pointer)&local_2918.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2918,"wl_B%d_S%d.dat","");
        format(&local_2888,&local_2918,(ulong)blocks,(ulong)uVar1);
        WangLandauSampler::export_entropy(&local_2848,&local_2888);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2888._M_dataplus._M_p != &local_2888.field_2) {
          operator_delete(local_2888._M_dataplus._M_p,local_2888.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2918._M_dataplus._M_p != &local_2918.field_2) {
          operator_delete(local_2918._M_dataplus._M_p,local_2918.field_2._M_allocated_capacity + 1);
        }
        local_28f8._M_dataplus._M_p = (pointer)&local_28f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_28f8,"results/histogram_wl_B%d_S%d.dat","");
        format(&local_28a8,&local_28f8,(ulong)blocks);
        Histogram<unsigned_int>::export_histogram(&local_28d8,&local_28a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_28a8._M_dataplus._M_p != &local_28a8.field_2) {
          operator_delete(local_28a8._M_dataplus._M_p,local_28a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_28f8._M_dataplus._M_p != &local_28f8.field_2) {
          operator_delete(local_28f8._M_dataplus._M_p,local_28f8.field_2._M_allocated_capacity + 1);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0xf);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_2868);
      local_2848.super_UniformSampler._vptr_UniformSampler = (_func_int **)&PTR_markov_step_0010bd08
      ;
      if (local_2848.entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2848.entropy.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2848.entropy.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2848.entropy.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::random_device::_M_fini();
      local_28d8._vptr_Histogram = (_func_int **)&PTR_v_0010bd70;
      if (local_28d8._histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28d8._histogram.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_28d8._histogram.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28d8._histogram.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2800.triangle_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2800.triangle_count.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2800.triangle_count.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2800.triangle_count.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_2800.links);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_2800.backwards_list._M_h);
      if (local_2800.node_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2800.node_list.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2800.node_list.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2800.node_list.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
    pcVar2 = "ROUND_TRIPS not defined";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

int main() {
    char *env_blocks = getenv("BLOCKS");
    if (env_blocks == NULL) {std::cout << "BLOCKS not defined" << std::endl; exit(1);}
    unsigned int blocks = (unsigned int)atoi(env_blocks);

    char *env_round_trips = getenv("ROUND_TRIPS");
    if (env_round_trips == NULL) {std::cout << "ROUND_TRIPS not defined" << std::endl; exit(1);}
    unsigned int round_trips = (unsigned int)atoi(env_round_trips);

    unsigned int total_wl_steps = 15;

    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(), network.get_triangles());
    Random rng(2);

    WangLandauSampler sampler(rng, histogram, network);

    // warm up
    while (network.get_triangles() != 0)
        sampler.markov_step();

    std::vector<std::vector<double> > result;

    for (unsigned int step = 0; step < total_wl_steps; step++) {
        histogram.reset();

        double mean_round_trip = 0;
        double std_round_trip = 0;
        for (unsigned int round_trip = 0; round_trip < round_trips; round_trip++) {
            unsigned int previous_count = histogram.count();
            sampler.perform_round_trip();
            unsigned int round_trip_time = histogram.count() - previous_count;

            // update formula: https://en.wikipedia.org/wiki/Algorithms_for_calculating_variance#Online_algorithm
            int n = round_trip + 1;
            double delta = round_trip_time - mean_round_trip;
            mean_round_trip += delta/n;
            std_round_trip += delta*(round_trip_time - mean_round_trip);
        }
        sampler.wang_landau_step();

        sampler.export_entropy(format("wl_B%d_S%d.dat", blocks, round_trips));
        histogram.export_histogram(format("results/histogram_wl_B%d_S%d.dat", blocks, round_trips));
    }
    return 0;
}